

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader.cpp
# Opt level: O0

void __thiscall
COLLADASaxFWL::MeshLoader::loadSourceElements
          (MeshLoader *this,MeshPrimitiveInputList *polyBaseElement)

{
  InputSharedArray *this_00;
  MeshLoader *this_01;
  MeshPrimitiveInputList *in_RSI;
  InputShared *input;
  size_t n;
  size_t numInputElements;
  InputSharedArray *inputArray;
  MeshLoader *input_00;
  
  this_00 = MeshPrimitiveInputList::getInputArray(in_RSI);
  this_01 = (MeshLoader *)
            COLLADAFW::ArrayPrimitiveType<COLLADASaxFWL::InputShared_*>::getCount(this_00);
  for (input_00 = (MeshLoader *)0x0; input_00 < this_01;
      input_00 = (MeshLoader *)
                 ((long)&((InputUnshared *)&input_00->super_SourceArrayLoader)->_vptr_InputUnshared
                 + 1)) {
    COLLADAFW::ArrayPrimitiveType<COLLADASaxFWL::InputShared_*>::operator[]
              (this_00,(size_t)input_00);
    loadSourceElement(this_01,(InputShared *)input_00);
  }
  return;
}

Assistant:

void MeshLoader::loadSourceElements ( const MeshPrimitiveInputList& polyBaseElement )
    {
        const InputSharedArray& inputArray = polyBaseElement.getInputArray ();
        size_t numInputElements = inputArray.getCount ();
        for ( size_t n=0; n<numInputElements; ++n )
        {
            // Get the input element and read the semantic.
            InputShared* input = inputArray [n];

            // Load the source element of the current input element into the framework mesh.
            loadSourceElement ( *input );
        }
    }